

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

char * __thiscall ImVector<char>::erase_unsorted(ImVector<char> *this,char *it)

{
  long lVar1;
  bool bVar2;
  ptrdiff_t off;
  char *it_local;
  ImVector<char> *this_local;
  
  bVar2 = false;
  if (this->Data <= it) {
    bVar2 = it < this->Data + this->Size;
  }
  if (!bVar2) {
    __assert_fail("it >= Data && it < Data+Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                  ,0x4f1,"T *ImVector<char>::erase_unsorted(const T *) [T = char]");
  }
  lVar1 = (long)it - (long)this->Data;
  if (it < this->Data + (long)this->Size + -1) {
    this->Data[lVar1] = this->Data[(long)this->Size + -1];
  }
  this->Size = this->Size + -1;
  return this->Data + lVar1;
}

Assistant:

inline T*           erase_unsorted(const T* it)         { IM_ASSERT(it >= Data && it < Data+Size);  const ptrdiff_t off = it - Data; if (it < Data+Size-1) memcpy(Data + off, Data + Size - 1, sizeof(T)); Size--; return Data + off; }